

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O0

utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
* __thiscall
utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
::operator=(utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
            *this,uint32_t x)

{
  back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  *pbVar1;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  local_48;
  ushort local_3a;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  local_38;
  ushort local_2a;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  local_28;
  value_type local_1e;
  uint32_t local_1c;
  utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  *puStack_18;
  uint32_t x_local;
  utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  *this_local;
  
  if (((x < 0xd800) || (0xdfff < x)) && (x < 0x110000)) {
    puStack_18 = this;
    if (x < 0x10000) {
      local_1e = (value_type)x;
      local_1c = x;
      local_28 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                 ::operator++(&this->_p,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_28);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
      ::operator=(pbVar1,&local_1e);
    }
    else {
      local_1c = x - 0x10000;
      local_2a = (ushort)(local_1c >> 10) | 0xd800;
      local_38 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                 ::operator++(&this->_p,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_38);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
      ::operator=(pbVar1,&local_2a);
      local_3a = (ushort)local_1c & 0x3ff | 0xdc00;
      local_48 = std::
                 back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
                 ::operator++(&this->_p,0);
      pbVar1 = std::
               back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_48);
      std::
      back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
      ::operator=(pbVar1,&local_3a);
    }
  }
  return this;
}

Assistant:

utf16insert_iterator& operator=(uint32_t x)
    {
        if (x>=0xd800 && x<0xe000)
            return *this;
        if (x>=0x110000)
            return *this;
        if (x<0x10000) {
            *_p++ = x;
            return *this;
        }
        x-=0x10000;
        *_p++ = 0xd800|(x>>10);
        *_p++ = 0xdc00|(x&0x3ff);
        return *this;
    }